

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_vfprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  jx9_value *pjVar2;
  io_private *piVar3;
  jx9_io_stream *pjVar4;
  jx9_int64 jVar5;
  int nArg_00;
  char *pcVar6;
  jx9_vm *pVm;
  int nLen;
  fprintf_data sFdata;
  SySet sArg;
  
  if ((((nArg < 3) || (((*apArg)->iFlags & 0x100) == 0)) || ((apArg[1]->iFlags & 1) == 0)) ||
     ((apArg[2]->iFlags & 0x40) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar6 = "Invalid arguments";
  }
  else {
    piVar3 = (io_private *)((*apArg)->x).pOther;
    if ((piVar3 != (io_private *)0x0) && (piVar3->iMagic == 0xfeac14)) {
      pjVar4 = piVar3->pStream;
      if (pjVar4 == (jx9_io_stream *)0x0) {
        pcVar6 = "null_stream";
      }
      else {
        if (pjVar4->xWrite != (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          pcVar6 = jx9_value_to_string(apArg[1],&nLen);
          if (0 < nLen) {
            nArg_00 = jx9HashmapValuesToSet((jx9_hashmap *)(apArg[2]->x).pOther,&sArg);
            sFdata.nCount = 0;
            sFdata.pIO = piVar3;
            jx9InputFormat(fprintfConsumer,pCtx,pcVar6,nLen,nArg_00,(jx9_value **)sArg.pBase,&sFdata
                           ,1);
            jVar5 = sFdata.nCount;
            pjVar2 = pCtx->pRet;
            jx9MemObjRelease(pjVar2);
            (pjVar2->x).iVal = jVar5;
            pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 2;
            if (sArg.pBase == (void *)0x0 || sArg.pAllocator == (SyMemBackend *)0x0) {
              return 0;
            }
            SyMemBackendFree(sArg.pAllocator,sArg.pBase);
            return 0;
          }
          goto LAB_0013eee0;
        }
        pcVar6 = pjVar4->zName;
      }
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 (pCtx->pFunc->sName).zString,pcVar6);
      goto LAB_0013eee0;
    }
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar6 = "Expecting an IO handle";
  }
  jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar6);
LAB_0013eee0:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = 0.0;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_vfprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	fprintf_data sFdata;
	const char *zFormat;
	jx9_hashmap *pMap;
	io_private *pDev;
	SySet sArg;
	int n, nLen;
	if( nArg < 3 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_string(apArg[1])  || !jx9_value_is_json_array(apArg[2]) ){
		/* Missing/Invalid arguments, return zero */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Invalid arguments");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	if( pDev->pStream == 0  || pDev->pStream->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pDev->pStream ? pDev->pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Empty string, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to hashmap */
	pMap = (jx9_hashmap *)apArg[2]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Prepare our private data */
	sFdata.nCount = 0;
	sFdata.pIO = pDev;
	/* Format the string */
	jx9InputFormat(fprintfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), (void *)&sFdata, TRUE);
	/* Return total number of bytes written*/
	jx9_result_int64(pCtx, sFdata.nCount);
	SySetRelease(&sArg);
	return JX9_OK;
}